

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O1

void TestRoundTrip(char *fn)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _func_int ***ppp_Var5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined8 uVar8;
  polymorphic_allocator<pbrt::Half> pVar9;
  _Base_ptr p_Var10;
  bool bVar11;
  Allocator AVar12;
  ulong uVar13;
  float *pfVar14;
  long lVar15;
  long lVar16;
  long *plVar17;
  Point2i p;
  long *****ppppplVar18;
  char *pcVar19;
  ColorEncodingHandle *encoding;
  long lVar20;
  int iVar21;
  undefined1 auVar22 [16];
  Float FVar23;
  undefined1 in_ZMM2 [64];
  undefined1 in_register_000012c4 [12];
  span<const_float> values;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  float delta;
  AssertionResult gtest_ar__1;
  Point2i res;
  AssertionResult gtest_ar_;
  string filename;
  ImageChannelDesc rgbDesc;
  ImageAndMetadata readImage;
  Image image;
  AssertHelper local_498;
  AssertHelper local_490;
  float local_484;
  string local_480;
  Tuple2<pbrt::Point2,_int> local_460;
  long local_458;
  char *local_450;
  undefined1 local_448 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  undefined1 local_418 [16];
  long *local_408 [2];
  long local_3f8 [2];
  string local_3e8;
  undefined1 local_3c8 [16];
  ImageChannelDesc local_3b0;
  ulong local_380;
  undefined1 local_378 [4];
  undefined1 auStack_374 [12];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_368;
  undefined1 *apuStack_358 [2];
  undefined1 auStack_348 [16];
  long ****local_338 [2];
  long ***appplStack_328 [6];
  undefined1 local_2f8 [60];
  bool bStack_2bc;
  undefined3 uStack_2bb;
  undefined1 local_2b8 [24];
  polymorphic_allocator<pbrt::Half> pStack_2a0;
  _Base_ptr p_Stack_298;
  _Base_ptr p_Stack_290;
  undefined1 *puStack_288;
  polymorphic_allocator<float> pStack_280;
  float *local_278;
  size_t local_270;
  size_t local_268;
  bool local_25c;
  bool local_218;
  bool local_1d4;
  bool local_1c0;
  bool local_1b4;
  bool local_1ac;
  bool local_1a4;
  bool local_198;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_190;
  ColorEncodingHandle local_158;
  ColorEncodingHandle local_150;
  Image local_148;
  
  local_460.x = 0x10;
  local_460.y = 0x1d;
  _local_378 = (optional<float>)(local_378 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"R","");
  apuStack_358[0] = local_378 + 0x30;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_378 + 0x20),"G","");
  ppppplVar18 = local_338 + 2;
  local_338[0] = (long ****)ppppplVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"B","");
  encoding = &local_150;
  local_150.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  local_450 = fn;
  AVar12.memoryResource = pstd::pmr::new_delete_resource();
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378;
  pbrt::Image::Image(&local_148,Float,(Point2i)0x1d00000010,channels,encoding,AVar12);
  lVar15 = -0x60;
  do {
    if (ppppplVar18 != (long *****)ppppplVar18[-2]) {
      operator_delete(ppppplVar18[-2],(long)*ppppplVar18 + 1);
    }
    ppppplVar18 = ppppplVar18 + -4;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0);
  if (0 < local_460.y) {
    lVar20 = 0;
    lVar15 = 0;
    do {
      uVar13 = (ulong)local_460 & 0xffffffff;
      if (0 < local_460.x) {
        local_3c8._0_4_ = (undefined4)(int)lVar15;
        local_3c8._4_12_ = in_register_000012c4;
        lVar16 = 0;
        do {
          auVar22._0_4_ = (float)(int)lVar16;
          auVar22._4_12_ = in_register_000012c4;
          auVar3 = vinsertps_avx(auVar22,ZEXT416((uint)local_3c8._0_4_),0x10);
          auVar4 = vpinsrd_avx(ZEXT416((uint)uVar13),local_460.y,1);
          auVar22 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
          in_ZMM2 = ZEXT1664(auVar22);
          auVar22 = vpaddd_avx(auVar4,auVar22);
          auVar22 = vcvtdq2ps_avx(auVar22);
          auVar22 = vdivps_avx(auVar3,auVar22);
          uVar2 = vmovlps_avx(auVar22);
          auStack_374._4_4_ = 0xbfc00000;
          _local_378 = (optional<float>)uVar2;
          values.n = 3;
          values.ptr = (float *)local_378;
          pbrt::Image::SetChannels(&local_148,(Point2i)(lVar20 + lVar16),values);
          lVar16 = lVar16 + 1;
          uVar13 = (ulong)local_460.x;
        } while (lVar16 < (long)uVar13);
      }
      lVar15 = lVar15 + 1;
      lVar20 = lVar20 + 0x100000000;
    } while (lVar15 < local_460.y);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_378,local_450,(allocator<char> *)local_448);
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e8,_local_378,(pointer)(auStack_374._4_8_ + (long)_local_378));
  if (_local_378 != (optional<float>)((long)local_378 + 0x10)) {
    operator_delete((void *)_local_378,aStack_368._M_allocated_capacity + 1);
  }
  _local_378 = ZEXT1664(ZEXT816(0) << 0x40);
  _local_2b8 = ZEXT1640(ZEXT816(0) << 0x40);
  p_Stack_290 = (_Base_ptr)(local_2b8 + 0x18);
  puStack_288 = local_2b8 + 0x18;
  pStack_280.memoryResource = (memory_resource *)0x0;
  _local_338 = _local_378;
  _local_2f8 = _local_378;
  bVar11 = pbrt::Image::Write(&local_148,&local_3e8,(ImageMetadata *)local_378);
  local_448[0] = (allocator<char>)bVar11;
  local_448._8_8_ = (float *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)(local_2b8 + 0x10));
  if ((bool)local_2b8[8] == true) {
    local_2b8[8] = 0;
  }
  if (bStack_2bc == true) {
    bStack_2bc = false;
  }
  if ((bool)local_2f8[0x34] == true) {
    local_2f8[0x34] = 0;
  }
  if ((bool)local_2f8[0x2c] == true) {
    local_2f8[0x2c] = 0;
  }
  if ((bool)local_2f8[0x20] == true) {
    local_2f8[0x20] = 0;
  }
  if ((bool)local_2f8[0xc] == true) {
    local_2f8[0xc] = 0;
  }
  if ((bool)local_338[1]._0_1_ == true) {
    local_338[1]._0_1_ = 0;
  }
  if ((bool)auStack_374[0] == true) {
    auStack_374[0] = 0;
  }
  if (local_448[0] == (allocator<char>)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_378,(internal *)local_448,(AssertionResult *)"image.Write(filename)",
               "false","true",(char *)encoding);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_480,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x279,(char *)_local_378);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_480,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_480);
    if (_local_378 != (optional<float>)((long)local_378 + 0x10)) {
      operator_delete((void *)_local_378,aStack_368._M_allocated_capacity + 1);
    }
    if ((Tuple2<pbrt::Point2,_int>)local_3b0.offset.alloc.memoryResource !=
        (Tuple2<pbrt::Point2,_int>)0x0) {
      bVar11 = testing::internal::IsTrue(true);
      if ((bVar11) &&
         ((Tuple2<pbrt::Point2,_int>)local_3b0.offset.alloc.memoryResource !=
          (Tuple2<pbrt::Point2,_int>)0x0)) {
        (**(code **)(*(long *)local_3b0.offset.alloc.memoryResource + 8))();
      }
      local_3b0.offset.alloc.memoryResource = (memory_resource *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_448 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_448 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    AVar12.memoryResource = pstd::pmr::new_delete_resource();
    local_158.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    pbrt::Image::Read((ImageAndMetadata *)local_378,&local_3e8,AVar12,&local_158);
    local_3b0.offset.alloc.memoryResource = (memory_resource *)auStack_374._0_8_;
    testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
              ((internal *)local_448,"readImage.image.Resolution()","res",(Point2<int> *)&local_3b0,
               (Point2<int> *)&local_460);
    if (local_448[0] == (allocator<char>)0x0) {
      testing::Message::Message((Message *)&local_3b0);
      if ((float *)local_448._8_8_ == (float *)0x0) {
        pcVar19 = "";
      }
      else {
        pcVar19 = *(char **)local_448._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_480,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x27c,pcVar19);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_480,(Message *)&local_3b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_480);
      if ((Tuple2<pbrt::Point2,_int>)local_3b0.offset.alloc.memoryResource !=
          (Tuple2<pbrt::Point2,_int>)0x0) {
        bVar11 = testing::internal::IsTrue(true);
        if ((bVar11) &&
           ((Tuple2<pbrt::Point2,_int>)local_3b0.offset.alloc.memoryResource !=
            (Tuple2<pbrt::Point2,_int>)0x0)) {
          (**(code **)(*(long *)local_3b0.offset.alloc.memoryResource + 8))();
        }
        local_3b0.offset.alloc.memoryResource = (memory_resource *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_448 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_448 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_448._0_8_ = local_448 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"R","");
      local_428._M_allocated_capacity = (size_type)local_418;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"G","");
      plVar17 = local_3f8;
      local_408[0] = plVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"B","");
      requestedChannels.n = 3;
      requestedChannels.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448;
      pbrt::Image::GetChannelDesc(&local_3b0,(Image *)local_378,requestedChannels);
      lVar15 = -0x60;
      do {
        if (plVar17 != (long *)plVar17[-2]) {
          operator_delete((long *)plVar17[-2],*plVar17 + 1);
        }
        plVar17 = plVar17 + -4;
        lVar15 = lVar15 + 0x20;
      } while (lVar15 != 0);
      local_480._M_dataplus._M_p._0_1_ = local_3b0.offset.nStored != 0;
      local_480._M_string_length = 0;
      if (local_3b0.offset.nStored == 0) {
        testing::Message::Message((Message *)&local_498);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_448,(internal *)&local_480,(AssertionResult *)"(bool)rgbDesc",
                   "false","true",(char *)encoding);
        testing::internal::AssertHelper::AssertHelper
                  (&local_490,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                   ,0x27f,(char *)local_448._0_8_);
        testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_498);
        testing::internal::AssertHelper::~AssertHelper(&local_490);
        if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
          operator_delete((void *)local_448._0_8_,local_438._M_allocated_capacity + 1);
        }
        if (local_498.data_ != (AssertHelperData *)0x0) {
          bVar11 = testing::internal::IsTrue(true);
          if ((bVar11) && (local_498.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_498.data_ + 8))();
          }
          local_498.data_ = (AssertHelperData *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_480._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_480._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (0 < local_460.y) {
          paVar1 = &local_480.field_2;
          local_458 = 0;
          do {
            if (0 < local_460.x) {
              local_380 = local_458 << 0x20;
              pcVar19 = (char *)0x0;
              do {
                p.super_Tuple2<pbrt::Point2,_int> =
                     (Tuple2<pbrt::Point2,_int>)(local_380 | (ulong)pcVar19);
                local_450 = pcVar19;
                pbrt::Image::GetChannels
                          ((ImageChannelValues *)local_448,(Image *)local_378,p,&local_3b0,
                           (WrapMode2D)0x200000002);
                lVar15 = 0;
                iVar21 = 0;
                do {
                  FVar23 = pbrt::Image::GetChannel(&local_148,p,iVar21,(WrapMode2D)0x200000002);
                  pfVar14 = (float *)local_448._8_8_;
                  if ((float *)local_448._8_8_ == (float *)0x0) {
                    pfVar14 = (float *)(local_448 + 0x10);
                  }
                  local_3c8._0_4_ = FVar23;
                  local_484 = FVar23 - *(float *)((long)pfVar14 + lVar15);
                  local_480._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"pfm","");
                  bVar11 = pbrt::HasExtension(&local_3e8,&local_480);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_480._M_dataplus._M_p != paVar1) {
                    operator_delete(local_480._M_dataplus._M_p,
                                    local_480.field_2._M_allocated_capacity + 1);
                  }
                  if (bVar11) {
                    local_498.data_ = local_498.data_ & 0xffffffff00000000;
                    testing::internal::CmpHelperEQ<int,float>
                              ((internal *)&local_480,"0","delta",(int *)&local_498,&local_484);
                    if ((char)local_480._M_dataplus._M_p == '\0') {
                      testing::Message::Message((Message *)&local_498);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_498.data_)->line,local_3e8._M_dataplus._M_p,
                                 local_3e8._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_498.data_)->line,":(",2);
                      std::ostream::operator<<((ostream *)&(local_498.data_)->line,(int)local_450);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_498.data_)->line,", ",2);
                      std::ostream::operator<<((ostream *)&(local_498.data_)->line,(int)local_458);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_498.data_)->line,") c = ",6);
                      std::ostream::operator<<((ostream *)&(local_498.data_)->line,iVar21);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_498.data_)->line," wrote ",7);
                      std::ostream::_M_insert<double>((double)(float)local_3c8._0_4_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_498.data_)->line,", read ",7);
                      pfVar14 = (float *)local_448._8_8_;
                      if ((float *)local_448._8_8_ == (float *)0x0) {
                        pfVar14 = (float *)(local_448 + 0x10);
                      }
                      std::ostream::_M_insert<double>((double)*(float *)((long)pfVar14 + lVar15));
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_498.data_)->line,", delta = ",10);
                      std::ostream::_M_insert<double>((double)local_484);
                      pcVar19 = "";
                      if ((undefined8 *)local_480._M_string_length != (undefined8 *)0x0) {
                        pcVar19 = *(char **)local_480._M_string_length;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_490,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                                 ,0x28a,pcVar19);
                      testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_498);
                      testing::internal::AssertHelper::~AssertHelper(&local_490);
                      if (local_498.data_ != (AssertHelperData *)0x0) {
                        bVar11 = testing::internal::IsTrue(true);
                        if ((bVar11) && (local_498.data_ != (AssertHelperData *)0x0)) {
                          (**(code **)(*(long *)local_498.data_ + 8))();
                        }
                        local_498.data_ = (AssertHelperData *)0x0;
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_480._M_string_length,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                  }
                  else {
                    local_480._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"exr","");
                    bVar11 = pbrt::HasExtension(&local_3e8,&local_480);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_480._M_dataplus._M_p != paVar1) {
                      operator_delete(local_480._M_dataplus._M_p,
                                      local_480.field_2._M_allocated_capacity + 1);
                    }
                    if (bVar11) {
                      if (lVar15 == 8) {
                        local_498.data_ = (AssertHelperData *)((ulong)local_498.data_._4_4_ << 0x20)
                        ;
                        testing::internal::CmpHelperEQ<int,float>
                                  ((internal *)&local_480,"0","delta",(int *)&local_498,&local_484);
                        if ((char)local_480._M_dataplus._M_p == '\0') {
                          testing::Message::Message((Message *)&local_498);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,"(",1);
                          std::ostream::operator<<
                                    ((ostream *)&(local_498.data_)->line,(int)local_450);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,", ",2);
                          std::ostream::operator<<
                                    ((ostream *)&(local_498.data_)->line,(int)local_458);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,") c = ",6);
                          std::ostream::operator<<((ostream *)&(local_498.data_)->line,2);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line," wrote ",7);
                          std::ostream::_M_insert<double>((double)(float)local_3c8._0_4_);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,", read ",7);
                          pfVar14 = (float *)local_448._8_8_;
                          if ((float *)local_448._8_8_ == (float *)0x0) {
                            pfVar14 = (float *)(local_448 + 0x10);
                          }
                          std::ostream::_M_insert<double>((double)pfVar14[2]);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,", delta = ",10);
                          std::ostream::_M_insert<double>((double)local_484);
                          pcVar19 = "";
                          if ((undefined8 *)local_480._M_string_length != (undefined8 *)0x0) {
                            pcVar19 = *(char **)local_480._M_string_length;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_490,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                                     ,0x290,pcVar19);
                          testing::internal::AssertHelper::operator=
                                    (&local_490,(Message *)&local_498);
                          testing::internal::AssertHelper::~AssertHelper(&local_490);
                          if (local_498.data_ != (AssertHelperData *)0x0) {
                            bVar11 = testing::internal::IsTrue(true);
                            if ((bVar11) && (local_498.data_ != (AssertHelperData *)0x0)) {
                              (**(code **)(*(long *)local_498.data_ + 8))();
                            }
                            local_498.data_ = (AssertHelperData *)0x0;
                          }
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_480._M_string_length,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                      }
                      else {
                        auVar4._8_4_ = 0x7fffffff;
                        auVar4._0_8_ = 0x7fffffff7fffffff;
                        auVar4._12_4_ = 0x7fffffff;
                        auVar22 = vandps_avx512vl(ZEXT416((uint)local_484),auVar4);
                        local_490.data_._0_4_ = auVar22._0_4_;
                        local_498.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
                        testing::internal::CmpHelperLT<float,double>
                                  ((internal *)&local_480,"std::abs(delta)",".001",
                                   (float *)&local_490,(double *)&local_498);
                        if ((char)local_480._M_dataplus._M_p == '\0') {
                          testing::Message::Message((Message *)&local_498);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,local_3e8._M_dataplus._M_p,
                                     local_3e8._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,":(",2);
                          std::ostream::operator<<
                                    ((ostream *)&(local_498.data_)->line,(int)local_450);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,", ",2);
                          std::ostream::operator<<
                                    ((ostream *)&(local_498.data_)->line,(int)local_458);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,") c = ",6);
                          std::ostream::operator<<((ostream *)&(local_498.data_)->line,iVar21);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line," wrote ",7);
                          std::ostream::_M_insert<double>((double)(float)local_3c8._0_4_);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,", read ",7);
                          pfVar14 = (float *)local_448._8_8_;
                          if ((float *)local_448._8_8_ == (float *)0x0) {
                            pfVar14 = (float *)(local_448 + 0x10);
                          }
                          std::ostream::_M_insert<double>
                                    ((double)*(float *)((long)pfVar14 + lVar15));
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_498.data_)->line,", delta = ",10);
                          std::ostream::_M_insert<double>((double)local_484);
                          pcVar19 = "";
                          if ((undefined8 *)local_480._M_string_length != (undefined8 *)0x0) {
                            pcVar19 = *(char **)local_480._M_string_length;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_490,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                                     ,0x294,pcVar19);
                          testing::internal::AssertHelper::operator=
                                    (&local_490,(Message *)&local_498);
                          testing::internal::AssertHelper::~AssertHelper(&local_490);
                          if (local_498.data_ != (AssertHelperData *)0x0) {
                            bVar11 = testing::internal::IsTrue(true);
                            if ((bVar11) && (local_498.data_ != (AssertHelperData *)0x0)) {
                              (**(code **)(*(long *)local_498.data_ + 8))();
                            }
                            local_498.data_ = (AssertHelperData *)0x0;
                          }
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_480._M_string_length,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                      }
                    }
                    else if (lVar15 == 8) {
                      local_498.data_ = (AssertHelperData *)((ulong)local_498.data_._4_4_ << 0x20);
                      pfVar14 = (float *)local_448._8_8_;
                      if ((float *)local_448._8_8_ == (float *)0x0) {
                        pfVar14 = (float *)(local_448 + 0x10);
                      }
                      testing::internal::CmpHelperEQ<int,float>
                                ((internal *)&local_480,"0","rgb[c]",(int *)&local_498,pfVar14 + 2);
                      if ((char)local_480._M_dataplus._M_p == '\0') {
                        testing::Message::Message((Message *)&local_498);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,"(",1);
                        std::ostream::operator<<((ostream *)&(local_498.data_)->line,(int)local_450)
                        ;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,", ",2);
                        std::ostream::operator<<((ostream *)&(local_498.data_)->line,(int)local_458)
                        ;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,") c = ",6);
                        std::ostream::operator<<((ostream *)&(local_498.data_)->line,2);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line," wrote ",7);
                        std::ostream::_M_insert<double>((double)(float)local_3c8._0_4_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,", read ",7);
                        pfVar14 = (float *)local_448._8_8_;
                        if ((float *)local_448._8_8_ == (float *)0x0) {
                          pfVar14 = (float *)(local_448 + 0x10);
                        }
                        std::ostream::_M_insert<double>((double)pfVar14[2]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line," (expected 0 back)",0x12);
                        pcVar19 = "";
                        if ((undefined8 *)local_480._M_string_length != (undefined8 *)0x0) {
                          pcVar19 = *(char **)local_480._M_string_length;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_490,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                                   ,0x29c,pcVar19);
                        testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_498)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_490);
                        if (local_498.data_ != (AssertHelperData *)0x0) {
                          bVar11 = testing::internal::IsTrue(true);
                          if ((bVar11) && (local_498.data_ != (AssertHelperData *)0x0)) {
                            (**(code **)(*(long *)local_498.data_ + 8))();
                          }
                          local_498.data_ = (AssertHelperData *)0x0;
                        }
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_480._M_string_length,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                    }
                    else {
                      auVar3._8_4_ = 0x7fffffff;
                      auVar3._0_8_ = 0x7fffffff7fffffff;
                      auVar3._12_4_ = 0x7fffffff;
                      auVar22 = vandps_avx512vl(ZEXT416((uint)local_484),auVar3);
                      local_490.data_._0_4_ = auVar22._0_4_;
                      local_498.data_ = (AssertHelperData *)&DAT_3f947ae147ae147b;
                      testing::internal::CmpHelperLT<float,double>
                                ((internal *)&local_480,"std::abs(delta)",".02",(float *)&local_490,
                                 (double *)&local_498);
                      if ((char)local_480._M_dataplus._M_p == '\0') {
                        testing::Message::Message((Message *)&local_498);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,local_3e8._M_dataplus._M_p,
                                   local_3e8._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,":(",2);
                        std::ostream::operator<<((ostream *)&(local_498.data_)->line,(int)local_450)
                        ;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,", ",2);
                        std::ostream::operator<<((ostream *)&(local_498.data_)->line,(int)local_458)
                        ;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,") c = ",6);
                        std::ostream::operator<<((ostream *)&(local_498.data_)->line,iVar21);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line," wrote ",7);
                        std::ostream::_M_insert<double>((double)(float)local_3c8._0_4_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,", read ",7);
                        pfVar14 = (float *)local_448._8_8_;
                        if ((float *)local_448._8_8_ == (float *)0x0) {
                          pfVar14 = (float *)(local_448 + 0x10);
                        }
                        std::ostream::_M_insert<double>((double)*(float *)((long)pfVar14 + lVar15));
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_498.data_)->line,", delta = ",10);
                        std::ostream::_M_insert<double>((double)local_484);
                        pcVar19 = "";
                        if ((undefined8 *)local_480._M_string_length != (undefined8 *)0x0) {
                          pcVar19 = *(char **)local_480._M_string_length;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_490,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                                   ,0x2a2,pcVar19);
                        testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_498)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_490);
                        if (local_498.data_ != (AssertHelperData *)0x0) {
                          bVar11 = testing::internal::IsTrue(true);
                          if ((bVar11) && (local_498.data_ != (AssertHelperData *)0x0)) {
                            (**(code **)(*(long *)local_498.data_ + 8))();
                          }
                          local_498.data_ = (AssertHelperData *)0x0;
                        }
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_480._M_string_length,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                    }
                  }
                  iVar21 = iVar21 + 1;
                  lVar15 = lVar15 + 4;
                } while (lVar15 != 0xc);
                local_428._8_8_ = 0;
                (**(code **)(*(long *)local_448._0_8_ + 0x18))
                          (local_448._0_8_,local_448._8_8_,local_428._M_allocated_capacity << 2,4);
                pcVar19 = local_450 + 1;
              } while ((long)pcVar19 < (long)local_460.x);
            }
            local_458 = local_458 + 1;
          } while (local_458 < local_460.y);
        }
        local_480._M_dataplus._M_p = local_480._M_dataplus._M_p & 0xffffffff00000000;
        iVar21 = remove(local_3e8._M_dataplus._M_p);
        local_498.data_._0_4_ = iVar21;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_448,"0","remove(filename.c_str())",(int *)&local_480,
                   (int *)&local_498);
        if (local_448[0] == (allocator<char>)0x0) {
          testing::Message::Message((Message *)&local_480);
          if ((float *)local_448._8_8_ == (float *)0x0) {
            pcVar19 = "";
          }
          else {
            pcVar19 = *(char **)local_448._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_498,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x2ab,pcVar19);
          testing::internal::AssertHelper::operator=(&local_498,(Message *)&local_480);
          testing::internal::AssertHelper::~AssertHelper(&local_498);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            bVar11 = testing::internal::IsTrue(true);
            if ((bVar11) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0)) {
              (**(code **)(*(size_type *)local_480._M_dataplus._M_p + 8))();
            }
            local_480._M_dataplus._M_p = (pointer)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_448 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      local_3b0.offset.nStored = 0;
      (**(code **)(*(long *)local_3b0.offset.alloc.memoryResource + 0x18))
                (local_3b0.offset.alloc.memoryResource,local_3b0.offset.ptr,
                 local_3b0.offset.nAlloc << 2,4);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_190);
    if (local_198 == true) {
      local_198 = false;
    }
    if (local_1a4 == true) {
      local_1a4 = false;
    }
    if (local_1ac == true) {
      local_1ac = false;
    }
    if (local_1b4 == true) {
      local_1b4 = false;
    }
    if (local_1c0 == true) {
      local_1c0 = false;
    }
    if (local_1d4 == true) {
      local_1d4 = false;
    }
    if (local_218 == true) {
      local_218 = false;
    }
    if (local_25c == true) {
      local_25c = false;
    }
    local_268 = 0;
    (*(pStack_280.memoryResource)->_vptr_memory_resource[3])
              (pStack_280.memoryResource,local_278,local_270 << 2,4);
    auVar6 = _local_2b8;
    puStack_288 = (undefined1 *)0x0;
    auVar7 = _local_2b8;
    pStack_2a0.memoryResource = auVar6._24_8_;
    pVar9.memoryResource = pStack_2a0.memoryResource;
    p_Stack_298 = auVar6._32_8_;
    p_Var10 = p_Stack_298;
    p_Stack_290 = auVar6._40_8_;
    lVar15 = (long)p_Stack_290 * 2;
    ppp_Var5 = &(pStack_2a0.memoryResource)->_vptr_memory_resource;
    _local_2b8 = auVar7;
    (*(*ppp_Var5)[3])(pVar9.memoryResource,p_Var10,lVar15,2);
    auVar6 = _local_2b8;
    local_2b8._16_8_ = 0;
    auVar7 = _local_2b8;
    local_2b8._0_8_ = auVar6._0_8_;
    uVar2 = local_2b8._0_8_;
    local_2b8._8_8_ = auVar6._8_8_;
    uVar8 = local_2b8._8_8_;
    _local_2b8 = auVar7;
    (**(code **)(*(long *)stack0xfffffffffffffd40 + 0x18))(stack0xfffffffffffffd40,uVar2,uVar8,1);
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_378 + 0x10));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  local_148.p32.nStored = 0;
  (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
  local_148.p16.nStored = 0;
  (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
  local_148.p8.nStored = 0;
  (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_148.channelNames);
  return;
}

Assistant:

static void TestRoundTrip(const char *fn) {
    Point2i res(16, 29);
    Image image(PixelFormat::Float, res, {"R", "G", "B"});
    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x)
            image.SetChannels({x, y}, {Float(x) / Float(res[0] - 1),
                                       Float(y) / Float(res[1] - 1), Float(-1.5)});

    std::string filename = inTestDir(fn);
    ASSERT_TRUE(image.Write(filename));

    ImageAndMetadata readImage = Image::Read(filename);
    ASSERT_EQ(readImage.image.Resolution(), res);

    ImageChannelDesc rgbDesc = readImage.image.GetChannelDesc({"R", "G", "B"});
    ASSERT_TRUE((bool)rgbDesc);

    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x) {
            ImageChannelValues rgb = readImage.image.GetChannels({x, y}, rgbDesc);

            for (int c = 0; c < 3; ++c) {
                float wrote = image.GetChannel({x, y}, c);
                float delta = wrote - rgb[c];
                if (HasExtension(filename, "pfm")) {
                    // Everything should come out exact.
                    EXPECT_EQ(0, delta) << filename << ":(" << x << ", " << y
                                        << ") c = " << c << " wrote " << wrote
                                        << ", read " << rgb[c] << ", delta = " << delta;
                } else if (HasExtension(filename, "exr")) {
                    if (c == 2)
                        // -1.5 is exactly representable as a float.
                        EXPECT_EQ(0, delta)
                            << "(" << x << ", " << y << ") c = " << c << " wrote "
                            << wrote << ", read " << rgb[c] << ", delta = " << delta;
                    else
                        EXPECT_LT(std::abs(delta), .001)
                            << filename << ":(" << x << ", " << y << ") c = " << c
                            << " wrote " << wrote << ", read " << rgb[c]
                            << ", delta = " << delta;
                } else {
                    // 8 bit format...
                    if (c == 2)
                        // -1.5 should be clamped to zero.
                        EXPECT_EQ(0, rgb[c])
                            << "(" << x << ", " << y << ") c = " << c << " wrote "
                            << wrote << ", read " << rgb[c] << " (expected 0 back)";
                    else
                        // Allow a fair amount of slop, since there's an sRGB
                        // conversion before quantization to 8-bits...
                        EXPECT_LT(std::abs(delta), .02)
                            << filename << ":(" << x << ", " << y << ") c = " << c
                            << " wrote " << wrote << ", read " << rgb[c]
                            << ", delta = " << delta;
                }
            }
        }

    // Clean up
    EXPECT_EQ(0, remove(filename.c_str()));
}